

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Destroy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  bool bVar1;
  LogMessage *other;
  string *this_00;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Arena *local_20;
  Arena *arena_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  
  if (arena == (Arena *)0x0) {
    local_20 = arena;
    arena_local = (Arena *)default_value;
    default_value_local = (string *)this;
    bVar1 = IsDonatedString(this);
    local_59 = 0;
    if (bVar1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
                 ,0xdd);
      local_59 = 1;
      other = LogMessage::operator<<(&local_58,"CHECK failed: !IsDonatedString(): ");
      LogFinisher::operator=(local_6d,other);
    }
    if ((local_59 & 1) != 0) {
      LogMessage::~LogMessage(&local_58);
    }
    bVar1 = IsDefault(this,(string *)arena_local);
    if ((!bVar1) && (this_00 = UnsafeMutablePointer_abi_cxx11_(this), this_00 != (string *)0x0)) {
      std::__cxx11::string::~string((string *)this_00);
      operator_delete(this_00);
    }
  }
  return;
}

Assistant:

void ArenaStringPtr::Destroy(const std::string* default_value,
                             ::google::protobuf::Arena* arena) {
  if (arena == nullptr) {
    GOOGLE_DCHECK(!IsDonatedString());
    if (!IsDefault(default_value)) {
      delete UnsafeMutablePointer();
    }
  }
}